

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless.c
# Opt level: O3

void VP8LConvertBGRAToRGBA_C(uint32_t *src,int num_pixels,uint8_t *dst)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  
  if (0 < num_pixels) {
    puVar1 = src + num_pixels;
    do {
      uVar2 = *src;
      src = src + 1;
      *dst = (uint8_t)(uVar2 >> 0x10);
      dst[1] = (uint8_t)(uVar2 >> 8);
      dst[2] = (uint8_t)uVar2;
      dst[3] = (uint8_t)(uVar2 >> 0x18);
      dst = dst + 4;
    } while (src < puVar1);
  }
  return;
}

Assistant:

void VP8LConvertBGRAToRGBA_C(const uint32_t* src,
                             int num_pixels, uint8_t* dst) {
  const uint32_t* const src_end = src + num_pixels;
  while (src < src_end) {
    const uint32_t argb = *src++;
    *dst++ = (argb >> 16) & 0xff;
    *dst++ = (argb >>  8) & 0xff;
    *dst++ = (argb >>  0) & 0xff;
    *dst++ = (argb >> 24) & 0xff;
  }
}